

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseData<std::__cxx11::list<int,std::allocator<int>>>::
resolve<std::__cxx11::list<int,std::allocator<int>>>
          (PromiseData<std::__cxx11::list<int,std::allocator<int>>> *this,
          list<int,_std::allocator<int>_> *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  list<int,_std::allocator<int>_> *__tmp;
  _Sp_counted_ptr_inplace<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var1;
  undefined1 local_19;
  
  p_Var1 = (_Sp_counted_ptr_inplace<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
            *)operator_new(0x28);
  std::
  _Sp_counted_ptr_inplace<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>,(__gnu_cxx::_Lock_policy)2>
  ::_Sp_counted_ptr_inplace<std::__cxx11::list<int,std::allocator<int>>>(p_Var1,&local_19,value);
  *(_Impl **)(this + 0x58) = &p_Var1->_M_impl;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60);
  *(_Sp_counted_ptr_inplace<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    **)(this + 0x60) = p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
  ::setSettled((PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
                *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }